

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

Index __thiscall
wasm::WasmBinaryReader::readMemoryAccess(WasmBinaryReader *this,Address *alignment,Address *offset)

{
  pointer puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  string local_68;
  string local_48;
  
  uVar2 = getU32LEB(this);
  if (8 < (uVar2 & 0xffffffbf)) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Alignment must be of a reasonable size","");
    throwError(this,&local_68);
  }
  uVar3 = Bits::pow2(uVar2 & 0xffffffbf);
  uVar4 = 0;
  alignment->addr = (ulong)uVar3;
  if ((uVar2 & 0x40) != 0) {
    uVar4 = getU32LEB(this);
  }
  puVar1 = (this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)uVar4 <
      (ulong)((long)(this->wasm->memories).
                    super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    if (*(long *)((long)puVar1[uVar4]._M_t.
                        super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> +
                 0x50) == 2) {
      uVar2 = getU32LEB(this);
      uVar5 = (ulong)uVar2;
    }
    else {
      uVar5 = getU64LEB(this);
    }
    offset->addr = uVar5;
    return uVar4;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Memory index out of range while reading memory alignment.","");
  throwError(this,&local_48);
}

Assistant:

Index WasmBinaryReader::readMemoryAccess(Address& alignment, Address& offset) {
  auto rawAlignment = getU32LEB();
  bool hasMemIdx = false;
  Index memIdx = 0;
  // Check bit 6 in the alignment to know whether a memory index is present per:
  // https://github.com/WebAssembly/multi-memory/blob/main/proposals/multi-memory/Overview.md
  if (rawAlignment & (1 << (6))) {
    hasMemIdx = true;
    // Clear the bit before we parse alignment
    rawAlignment = rawAlignment & ~(1 << 6);
  }

  if (rawAlignment > 8) {
    throwError("Alignment must be of a reasonable size");
  }

  alignment = Bits::pow2(rawAlignment);
  if (hasMemIdx) {
    memIdx = getU32LEB();
  }
  if (memIdx >= wasm.memories.size()) {
    throwError("Memory index out of range while reading memory alignment.");
  }
  auto* memory = wasm.memories[memIdx].get();
  offset = memory->addressType == Type::i32 ? getU32LEB() : getU64LEB();

  return memIdx;
}